

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void * lua_touserdata(lua_State *L,int idx)

{
  TValue *pTVar1;
  GCObject *pGVar2;
  
  pTVar1 = index2adr(L,idx);
  if (pTVar1->tt == 2) {
    pGVar2 = (pTVar1->value).gc;
  }
  else if (pTVar1->tt == 7) {
    pGVar2 = (GCObject *)&(((pTVar1->value).gc)->h).lastfree;
  }
  else {
    pGVar2 = (GCObject *)0x0;
  }
  return pGVar2;
}

Assistant:

static void*lua_touserdata(lua_State*L,int idx){
StkId o=index2adr(L,idx);
switch(ttype(o)){
case 7:return(rawuvalue(o)+1);
case 2:return pvalue(o);
default:return NULL;
}
}